

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

int TUPU::base64_decode(string *ascdata,void **buf_ptr,size_t *but_len)

{
  int len_00;
  int iVar1;
  long lVar2;
  char *__dest;
  char *__src;
  size_t sVar3;
  void *__s;
  BIO_METHOD *type;
  BIO *pBVar4;
  BIO *append;
  long *in_RDX;
  undefined8 *in_RSI;
  size_t len;
  uchar *buffer;
  int length;
  char *input;
  size_t input_len;
  BIO *b64;
  BIO *bmem;
  char *in_stack_ffffffffffffffb0;
  
  lVar2 = std::__cxx11::string::size();
  __dest = (char *)malloc(lVar2 + 1U);
  memset(__dest,0,lVar2 + 1U);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  sVar3 = calcDecodeLength(in_stack_ffffffffffffffb0);
  len_00 = (int)sVar3;
  __s = malloc((long)(len_00 + 1));
  memset(__s,0,(long)(len_00 + 1));
  type = BIO_f_base64();
  pBVar4 = BIO_new(type);
  append = BIO_new_mem_buf(__dest,-1);
  pBVar4 = BIO_push(pBVar4,append);
  BIO_set_flags(pBVar4,0x100);
  iVar1 = BIO_read(pBVar4,__s,len_00);
  if (iVar1 == len_00) {
    BIO_free_all(pBVar4);
    *in_RSI = __s;
    *in_RDX = (long)len_00;
    free(__dest);
    return 0;
  }
  __assert_fail("len == (size_t)length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuputech[P]tupu-cpp-sdk/src/Base64.cpp"
                ,0x58,"int TUPU::base64_decode(const string &, void **, size_t *)");
}

Assistant:

int TUPU::base64_decode(const string & ascdata, void **buf_ptr, size_t *but_len)
{
    BIO *bmem, *b64;

    size_t input_len = ascdata.size() + 1;
    char *input = (char *)malloc(input_len);
    memset(input, 0, input_len);
    strcpy(input, ascdata.c_str());

    int length = calcDecodeLength(input);
    unsigned char *buffer = (unsigned char*)malloc(length + 1);
    memset(buffer, 0, length + 1);

    b64 = BIO_new(BIO_f_base64());
    bmem = BIO_new_mem_buf(input, -1);
    b64 = BIO_push(b64, bmem);

    //Do not use newlines to flush buffer
    BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);

    size_t len = BIO_read(b64, buffer, length);
    assert(len == (size_t)length);
    //string result((char*)buffer, length);

    //free(buffer);
    BIO_free_all(b64);

    *buf_ptr = buffer;
    *but_len = length;

    free(input);

    return 0;
}